

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O3

Statement *
slang::ast::ExpressionStatement::fromSyntax
          (Compilation *compilation,VoidCastedCallStatementSyntax *syntax,ASTContext *context)

{
  ExpressionSyntax *pEVar1;
  Type *pTVar2;
  bool bVar3;
  int iVar4;
  SubroutineKind SVar5;
  undefined4 extraout_var;
  SourceLocation SVar6;
  InvalidStatement *pIVar7;
  Type *pTVar8;
  Diagnostic *this_00;
  char *func;
  string_view arg;
  SourceRange local_38;
  CallExpression *this;
  
  pEVar1 = (syntax->expr).ptr;
  if (pEVar1 == (ExpressionSyntax *)0x0) {
    func = 
    "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
    ;
    goto LAB_0028f0b4;
  }
  iVar4 = Expression::bind((int)pEVar1,(sockaddr *)context,0);
  this = (CallExpression *)CONCAT44(extraout_var,iVar4);
  local_38 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  SVar6 = (SourceLocation)
          BumpAllocator::
          emplace<slang::ast::ExpressionStatement,slang::ast::Expression_const&,slang::SourceRange>
                    (&compilation->super_BumpAllocator,(Expression *)this,&local_38);
  bVar3 = Expression::bad((Expression *)this);
  if (bVar3) goto LAB_0028f00e;
  if ((this->super_Expression).kind != Call) {
LAB_0028eff9:
    ASTContext::addDiag(context,(DiagCode)0x4a0008,(this->super_Expression).sourceRange);
LAB_0028f00e:
    local_38.startLoc = SVar6;
    pIVar7 = BumpAllocator::emplace<slang::ast::InvalidStatement,slang::ast::Statement_const*&>
                       (&compilation->super_BumpAllocator,(Statement **)&local_38);
    return &pIVar7->super_Statement;
  }
  SVar5 = CallExpression::getSubroutineKind(this);
  if (SVar5 == Task) {
    pTVar2 = (this->super_Expression).type.ptr;
    if (pTVar2 != (Type *)0x0) {
      pTVar8 = pTVar2->canonical;
      if (pTVar8 == (Type *)0x0) {
        Type::resolveCanonical(pTVar2);
        pTVar8 = pTVar2->canonical;
      }
      if ((pTVar8->super_Symbol).kind == VoidType) goto LAB_0028eff9;
      goto LAB_0028f030;
    }
  }
  else {
LAB_0028f030:
    pTVar2 = (this->super_Expression).type.ptr;
    if (pTVar2 != (Type *)0x0) {
      pTVar8 = pTVar2->canonical;
      if (pTVar8 == (Type *)0x0) {
        Type::resolveCanonical(pTVar2);
        pTVar8 = pTVar2->canonical;
      }
      if ((pTVar8->super_Symbol).kind != VoidType) {
        return (Statement *)SVar6;
      }
      this_00 = ASTContext::addDiag(context,(DiagCode)0x500008,(this->super_Expression).sourceRange)
      ;
      if ((this->super_Expression).kind == Call) {
        arg = CallExpression::getSubroutineName(this);
        Diagnostic::operator<<(this_00,arg);
        return (Statement *)SVar6;
      }
      assert::assertFailed
                ("T::isKind(kind)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Expression.h"
                 ,299,"const T &slang::ast::Expression::as() const [T = slang::ast::CallExpression]"
                );
    }
  }
  func = "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]";
LAB_0028f0b4:
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

Statement& ExpressionStatement::fromSyntax(Compilation& compilation,
                                           const VoidCastedCallStatementSyntax& syntax,
                                           const ASTContext& context) {
    auto& expr = Expression::bind(*syntax.expr, context);
    auto result = compilation.emplace<ExpressionStatement>(expr, syntax.sourceRange());
    if (expr.bad())
        return badStmt(compilation, result);

    if (expr.kind != ExpressionKind::Call ||
        (expr.as<CallExpression>().getSubroutineKind() == SubroutineKind::Task &&
         expr.type->isVoid())) {
        context.addDiag(diag::VoidCastFuncCall, expr.sourceRange);
        return badStmt(compilation, result);
    }

    if (expr.type->isVoid()) {
        context.addDiag(diag::PointlessVoidCast, expr.sourceRange)
            << expr.as<CallExpression>().getSubroutineName();
    }

    return *result;
}